

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

void __thiscall slang::ast::UnrollVisitor::runForReal(UnrollVisitor *this,ForLoopStatement *loop)

{
  SourceLocation location;
  bool bVar1;
  AssignFlags value;
  type *ppAVar2;
  type this_00;
  iterator pPVar3;
  iterator alloc;
  byte *in_RDI;
  ValueDriver *in_stack_00000020;
  ValueSymbol *in_stack_00000028;
  DriverBitRange in_stack_00000030;
  iterator it;
  ValueDriver *driver;
  PerAssignDriverState *state;
  iterator __end4;
  iterator __begin4;
  SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *__range4;
  type *stateVec_1;
  type *expr_1;
  iterator __end3_1;
  iterator __begin3_1;
  flat_hash_map<const_AssignmentExpression_*,_std::unique_ptr<SmallVector<PerAssignDriverState>_>_>
  *__range3_1;
  Symbol *containingSym;
  AssignFlags flags;
  type *stateVec;
  type *expr;
  iterator __end3;
  iterator __begin3;
  flat_hash_map<const_AssignmentExpression_*,_std::unique_ptr<SmallVector<PerAssignDriverState>_>_>
  *__range3;
  ForLoopStatement *in_stack_fffffffffffffe28;
  const_iterator *in_stack_fffffffffffffe30;
  EvalContext *in_stack_fffffffffffffe40;
  ValueSymbol *in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe50;
  byte in_stack_fffffffffffffe56;
  undefined1 in_stack_fffffffffffffe57;
  Symbol *args_2;
  Expression *in_stack_fffffffffffffe60;
  DriverKind *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  EvalContext *in_stack_fffffffffffffe90;
  iterator this_01;
  Expression *in_stack_ffffffffffffff88;
  ASTContext *in_stack_ffffffffffffff90;
  Expression *in_stack_ffffffffffffff98;
  bitmask<slang::ast::AssignFlags> in_stack_ffffffffffffffa7;
  undefined7 in_stack_ffffffffffffffa8;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  EvalContext::reset(in_stack_fffffffffffffe40);
  EvalContext::pushEmptyFrame(in_stack_fffffffffffffe90);
  ASTVisitor<slang::ast::UnrollVisitor,_true,_false,_false,_false>::
  visit<slang::ast::ForLoopStatement>
            ((ASTVisitor<slang::ast::UnrollVisitor,_true,_false,_false,_false> *)
             in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if ((*in_RDI & 1) == 0) {
    ASTContext::getContainingSymbol((ASTContext *)in_stack_fffffffffffffe30);
    boost::unordered::
    unordered_flat_map<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
    ::begin((unordered_flat_map<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
             *)0xa3e314);
    boost::unordered::
    unordered_flat_map<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
    ::end((unordered_flat_map<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
           *)0xa3e331);
    while (bVar1 = boost::unordered::detail::foa::operator!=
                             ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffffe30,
                              (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffffe28), bVar1) {
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   *)0xa3e36c);
      std::
      get<0ul,slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>
                ((pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>
                  *)0xa3e381);
      std::
      get<1ul,slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>
                ((pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>
                  *)0xa3e396);
      this_00 = std::
                unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
                ::operator*((unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
                             *)in_stack_fffffffffffffe30);
      pPVar3 = SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>::begin
                         (&this_00->
                           super_SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>);
      alloc = SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>::end
                        (&this_00->
                          super_SmallVectorBase<slang::ast::UnrollVisitor::PerAssignDriverState>);
      while (pPVar3 != alloc) {
        args_2 = *(Symbol **)(in_RDI + 0x360);
        this_01 = pPVar3;
        not_null<const_slang::ast::Expression_*>::operator*
                  ((not_null<const_slang::ast::Expression_*> *)0xa3e429);
        BumpAllocator::
        emplace<slang::ast::ValueDriver,slang::ast::DriverKind,slang::ast::Expression_const&,slang::ast::Symbol_const&,slang::ast::AssignFlags>
                  ((BumpAllocator *)
                   CONCAT17(in_stack_fffffffffffffe77,
                            CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
                   in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,args_2,
                   (AssignFlags *)
                   CONCAT17(in_stack_fffffffffffffe57,
                            CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
        IntervalMap<unsigned_long,_std::monostate,_0U>::begin
                  ((IntervalMap<unsigned_long,_std::monostate,_0U> *)in_stack_fffffffffffffe48);
        while( true ) {
          IntervalMap<unsigned_long,_std::monostate,_0U>::end
                    ((IntervalMap<unsigned_long,_std::monostate,_0U> *)in_stack_fffffffffffffe48);
          in_stack_fffffffffffffe57 =
               IntervalMap<unsigned_long,_std::monostate,_0U>::const_iterator::operator==
                         (in_stack_fffffffffffffe30,(const_iterator *)in_stack_fffffffffffffe28);
          in_stack_fffffffffffffe56 = in_stack_fffffffffffffe57 ^ 0xff;
          IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::~iterator((iterator *)0xa3e4bb);
          if ((in_stack_fffffffffffffe56 & 1) == 0) break;
          in_stack_fffffffffffffe48 =
               not_null<const_slang::ast::ValueSymbol_*>::operator->
                         ((not_null<const_slang::ast::ValueSymbol_*> *)0xa3e513);
          IntervalMap<unsigned_long,_std::monostate,_0U>::const_iterator::bounds
                    ((const_iterator *)
                     CONCAT17(in_stack_fffffffffffffe57,
                              CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)));
          ValueSymbol::addDriver(in_stack_00000028,in_stack_00000030,in_stack_00000020);
          IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::operator++
                    ((iterator *)in_stack_fffffffffffffe30);
        }
        IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::~iterator((iterator *)0xa3e4d0);
        in_stack_fffffffffffffe30 = (const_iterator *)&pPVar3->intervals;
        Compilation::getUnrollIntervalMapAllocator(*(Compilation **)(in_RDI + 0x360));
        IntervalMap<unsigned_long,_std::monostate,_0U>::clear
                  ((IntervalMap<unsigned_long,_std::monostate,_0U> *)this_01,(allocator_type *)alloc
                  );
        pPVar3 = this_01 + 1;
      }
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    *)in_stack_fffffffffffffe30);
    }
  }
  else {
    boost::unordered::
    unordered_flat_map<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
    ::begin((unordered_flat_map<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
             *)0xa3e192);
    boost::unordered::
    unordered_flat_map<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
    ::end((unordered_flat_map<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>,_slang::hash<const_slang::ast::AssignmentExpression_*,_void>,_std::equal_to<const_slang::ast::AssignmentExpression_*>,_std::allocator<std::pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>_>_>
           *)0xa3e1af);
    while (bVar1 = boost::unordered::detail::foa::operator!=
                             ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffffe30,
                              (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffffe28), bVar1) {
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   *)0xa3e1ea);
      ppAVar2 = std::
                get<0ul,slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>
                          ((pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>
                            *)0xa3e1ff);
      std::
      get<1ul,slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>
                ((pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>
                  *)0xa3e214);
      value = AssignmentExpression::isNonBlocking(*ppAVar2);
      AssignmentExpression::left(*ppAVar2);
      SourceLocation::SourceLocation((SourceLocation *)&stack0xffffffffffffffa0);
      bitmask<slang::ast::AssignFlags>::bitmask
                ((bitmask<slang::ast::AssignFlags> *)&stack0xffffffffffffff9f,value);
      location._7_1_ = value;
      location._0_7_ = in_stack_ffffffffffffffa8;
      Expression::requireLValue
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,location,
                 in_stack_ffffffffffffffa7,in_stack_ffffffffffffff88);
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::AssignmentExpression_*,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    *)in_stack_fffffffffffffe30);
    }
  }
  return;
}

Assistant:

void runForReal(const ForLoopStatement& loop) {
        // Revisit the loop with setupMode turned off.
        anyErrors = false;
        setupMode = false;
        evalCtx.reset();
        evalCtx.pushEmptyFrame();
        visit(loop);

        if (anyErrors) {
            // We can't correctly apply our collected intervals if there are errors,
            // so just visit each assignment expression like normal to make sure
            // errors get issued.
            for (auto& [expr, stateVec] : driverMap) {
                auto flags = expr->isNonBlocking() ? AssignFlags::NonBlocking : AssignFlags::None;
                expr->left().requireLValue(astCtx, {}, flags);
            }
        }
        else {
            // Find our finished driver interval maps and apply them.
            auto& containingSym = astCtx.getContainingSymbol();
            for (auto& [expr, stateVec] : driverMap) {
                for (auto& state : *stateVec) {
                    auto driver = comp.emplace<ValueDriver>(DriverKind::Procedural,
                                                            *state.longestStaticPrefix,
                                                            containingSym, AssignFlags::None);

                    for (auto it = state.intervals.begin(); it != state.intervals.end(); ++it)
                        state.symbol->addDriver(it.bounds(), *driver);

                    state.intervals.clear(comp.getUnrollIntervalMapAllocator());
                }
            }
        }
    }